

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::AddSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name,char *regex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  cmSourceGroup *this_00;
  string *psVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  currentName;
  char *local_338;
  ulong local_330;
  string local_328;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  cmSourceGroup local_2f0;
  
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_308.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar7 = (int)((ulong)((long)(name->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 5) - 1;
  local_338 = regex;
  if ((int)uVar7 < 0) {
    this_00 = (cmSourceGroup *)0x0;
    uVar8 = uVar7;
  }
  else {
    lVar9 = (ulong)uVar7 * 0x20 + 0x20;
    lVar5 = (ulong)uVar7 + 1;
    local_330 = (ulong)uVar7;
    do {
      pbVar2 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_assign_aux<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_308,
                 pbVar2,(long)&(pbVar2->_M_dataplus)._M_p + lVar9);
      this_00 = GetSourceGroup(this,&local_308);
      if (this_00 != (cmSourceGroup *)0x0) {
        uVar7 = (int)lVar5 - 1;
        goto LAB_00307ba8;
      }
      lVar9 = lVar9 + -0x20;
      lVar6 = lVar5 + -1;
      bVar3 = 0 < lVar5;
      lVar5 = lVar6;
    } while (lVar6 != 0 && bVar3);
    uVar7 = 0xffffffff;
    this_00 = (cmSourceGroup *)0x0;
LAB_00307ba8:
    uVar8 = (uint)local_330;
  }
  if (uVar7 == uVar8) {
    if (this_00 != (cmSourceGroup *)0x0 && local_338 != (char *)0x0) {
      cmSourceGroup::SetGroupRegex(this_00,local_338);
    }
  }
  else {
    if (uVar7 == 0xffffffff) {
      std::vector<cmSourceGroup,std::allocator<cmSourceGroup>>::
      emplace_back<std::__cxx11::string_const&,char_const*&>
                ((vector<cmSourceGroup,std::allocator<cmSourceGroup>> *)&this->SourceGroups,
                 (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,&local_338);
      this_00 = GetSourceGroup(this,&local_308);
      uVar7 = 0;
    }
    if (this_00 == (cmSourceGroup *)0x0) {
      paVar1 = &local_2f0.Name.field_2;
      local_2f0.Name._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2f0,"Could not create source group ","");
      cmSystemTools::Error(&local_2f0.Name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0.Name._M_dataplus._M_p != paVar1) {
        operator_delete(local_2f0.Name._M_dataplus._M_p,
                        local_2f0.Name.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      if ((int)uVar8 < (int)uVar7) {
        uVar8 = uVar7;
      }
      lVar9 = ~(long)(int)uVar8 + (long)(int)uVar7;
      lVar5 = (long)(int)uVar7 * 0x20;
      while( true ) {
        lVar9 = lVar9 + 1;
        if (lVar9 == 0) break;
        pbVar2 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        lVar6 = *(long *)((long)&pbVar2[1]._M_dataplus._M_p + lVar5);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_328,lVar6,
                   *(long *)((long)&pbVar2[1]._M_string_length + lVar5) + lVar6);
        psVar4 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
        cmSourceGroup::cmSourceGroup(&local_2f0,&local_328,(char *)0x0,(psVar4->_M_dataplus)._M_p);
        cmSourceGroup::AddChild(this_00,&local_2f0);
        cmSourceGroup::~cmSourceGroup(&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
        }
        this_00 = cmSourceGroup::LookupChild
                            (this_00,(string *)
                                     ((long)&(name->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start[1].
                                             _M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + 0x20;
      }
      cmSourceGroup::SetGroupRegex(this_00,local_338);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_308);
  return;
}

Assistant:

void cmMakefile::AddSourceGroup(const std::vector<std::string>& name,
                                const char* regex)
{
  cmSourceGroup* sg = nullptr;
  std::vector<std::string> currentName;
  int i = 0;
  const int lastElement = static_cast<int>(name.size() - 1);
  for (i = lastElement; i >= 0; --i) {
    currentName.assign(name.begin(), name.begin() + i + 1);
    sg = this->GetSourceGroup(currentName);
    if (sg != nullptr) {
      break;
    }
  }

  // i now contains the index of the last found component
  if (i == lastElement) {
    // group already exists, replace its regular expression
    if (regex && sg) {
      // We only want to set the regular expression.  If there are already
      // source files in the group, we don't want to remove them.
      sg->SetGroupRegex(regex);
    }
    return;
  }
  if (i == -1) {
    // group does not exist nor belong to any existing group
    // add its first component
    this->SourceGroups.emplace_back(name[0], regex);
    sg = this->GetSourceGroup(currentName);
    i = 0; // last component found
  }
  if (!sg) {
    cmSystemTools::Error("Could not create source group ");
    return;
  }
  // build the whole source group path
  for (++i; i <= lastElement; ++i) {
    sg->AddChild(cmSourceGroup(name[i], nullptr, sg->GetFullName().c_str()));
    sg = sg->LookupChild(name[i]);
  }

  sg->SetGroupRegex(regex);
}